

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImTextCountCharsFromUtf8(char *in_text,char *in_text_end)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  bool bVar2;
  uint c;
  int char_count;
  uint local_18;
  int local_14;
  char *local_10;
  char *local_8;
  
  local_14 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    if ((local_10 == (char *)0x0) || (bVar2 = false, local_8 < local_10)) {
      bVar2 = *local_8 != '\0';
    }
    if (!bVar2) break;
    iVar1 = ImTextCharFromUtf8(&local_18,local_8,local_10);
    local_8 = local_8 + iVar1;
    if (local_18 == 0) {
      return local_14;
    }
    if (local_18 < 0x10000) {
      local_14 = local_14 + 1;
    }
  }
  return local_14;
}

Assistant:

int ImTextCountCharsFromUtf8(const char* in_text, const char* in_text_end)
{
    int char_count = 0;
    while ((!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c;
        in_text += ImTextCharFromUtf8(&c, in_text, in_text_end);
        if (c == 0)
            break;
        if (c < 0x10000)
            char_count++;
    }
    return char_count;
}